

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wall_timer_options.h
# Opt level: O1

void __thiscall miniros::WallTimerOptions::~WallTimerOptions(WallTimerOptions *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Manager_type p_Var1;
  
  this_00 = (this->tracked_object).super___shared_ptr<const_void,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  p_Var1 = (this->callback).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->callback,(_Any_data *)&this->callback,__destroy_functor);
  }
  return;
}

Assistant:

struct MINIROS_DECL WallTimerOptions
{
  WallTimerOptions()
  : period(0.1)
  , callback_queue(0)
  , oneshot(false)
  , autostart(true)
  {
  }

  /*
   * \brief Constructor
   * \param
   */
  WallTimerOptions(WallDuration _period, const WallTimerCallback& _callback, CallbackQueueInterface* _queue, 
                   bool oneshot = false, bool autostart = true)
  : period(_period)
  , callback(_callback)
  , callback_queue(_queue)
  , oneshot(oneshot)
  , autostart(autostart)
  {}

  WallDuration period;                                              ///< The period to call the callback at
  WallTimerCallback callback;                                       ///< The callback to call

  CallbackQueueInterface* callback_queue;                           ///< Queue to add callbacks to.  If NULL, the global callback queue will be used

  /**
   * A shared pointer to an object to track for these callbacks.  If set, the a weak_ptr will be created to this object,
   * and if the reference count goes to 0 the subscriber callbacks will not get called.
   *
   * \note Note that setting this will cause a new reference to be added to the object before the
   * callback, and for it to go out of scope (and potentially be deleted) in the code path (and therefore
   * thread) that the callback is invoked from.
   */
  VoidConstPtr tracked_object;

  bool oneshot;
  bool autostart;
}